

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::create_torrent::create_torrent
          (create_torrent *this,file_storage *fs,int piece_size,create_flags_t flags)

{
  int in_R8D;
  span<const_libtorrent::create_file_entry> files;
  anon_unknown_40 *local_120;
  undefined8 local_118;
  file_storage local_110;
  uint local_44;
  vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> local_40;
  int local_24;
  file_storage *pfStack_20;
  int piece_size_local;
  file_storage *fs_local;
  create_torrent *this_local;
  create_flags_t flags_local;
  
  local_24 = piece_size;
  pfStack_20 = fs;
  fs_local = (file_storage *)this;
  this_local._4_4_ = flags.m_val;
  anon_unknown_40::convert_file_storage(&local_40,fs);
  local_44 = this_local._4_4_;
  create_torrent(this,&local_40,local_24,this_local._4_4_);
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  ~vector(&local_40);
  span<libtorrent::create_file_entry_const>::
  span<libtorrent::aux::container_wrapper<libtorrent::create_file_entry,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>>,libtorrent::create_file_entry,void>
            ((span<libtorrent::create_file_entry_const> *)&local_120,&this->m_files);
  files.m_len._0_4_ = this->m_piece_length;
  files.m_ptr = (create_file_entry *)local_118;
  files.m_len._4_4_ = 0;
  anon_unknown_40::make_file_storage(&local_110,local_120,files,in_R8D);
  file_storage::operator=(pfStack_20,&local_110);
  file_storage::~file_storage(&local_110);
  file_storage::set_num_pieces(pfStack_20,this->m_num_pieces);
  file_storage::set_piece_length(pfStack_20,this->m_piece_length);
  return;
}

Assistant:

create_torrent::create_torrent(file_storage& fs, int piece_size
		, create_flags_t const flags)
		: create_torrent(convert_file_storage(fs), piece_size, flags)
	{
		// for backwards compatibility
		fs = make_file_storage(m_files, m_piece_length);
		fs.set_num_pieces(m_num_pieces);
		fs.set_piece_length(m_piece_length);
	}